

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_DefineProperty(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  ushort uVar1;
  JSShape *pJVar2;
  bool bVar3;
  bool bVar4;
  JSValue val_00;
  JSValue val_01;
  JSValue op1;
  JSValue val_02;
  JSValueUnion JVar5;
  JSGCObjectHeader *pJVar6;
  JSContext *pJVar7;
  BOOL BVar8;
  int iVar9;
  int iVar10;
  JSValueUnion JVar11;
  uint uVar12;
  char *fmt;
  JSFloat64Union u;
  ulong uVar13;
  JSValueUnion *pJVar14;
  uint uVar15;
  JSValueUnion p;
  char cVar16;
  JSValue this_obj_00;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue JVar17;
  JSValue prop_00;
  JSShapeProperty *prs;
  uint local_9c;
  JSValueUnion local_98;
  JSContext *local_90;
  char local_82;
  char local_81;
  JSValueUnion local_80;
  uint local_78;
  undefined4 uStack_74;
  JSShape *local_70;
  JSValueUnion local_68;
  uint local_5c;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  local_80 = val.u;
  local_50 = this_obj.tag;
  p = this_obj.u;
  local_58 = p;
  if ((int)this_obj.tag != -1) {
    JS_ThrowTypeError(ctx,"not an object");
    return -1;
  }
  local_78 = (uint)val.tag;
  uStack_74 = val.tag._4_4_;
  local_68.int32 = prop & 0x7fffffff;
  local_68._4_4_ = 0;
  local_5c = (uint)flags >> 8;
  bVar3 = (~(flags & local_5c | ~local_5c) & 7) == 0;
  bVar4 = (flags & 0x1800U) == 0;
  local_81 = bVar3 && bVar4;
  local_82 = !bVar3 || !bVar4;
  local_90 = ctx;
LAB_001209c8:
  pJVar7 = local_90;
  local_48.float64 = local_58.float64;
  do {
    pJVar2 = *(JSShape **)((long)p.ptr + 0x18);
    uVar12 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
    if (uVar12 == 0) {
      pJVar14 = (JSValueUnion *)0x0;
      local_70 = (JSShape *)0x0;
    }
    else {
      do {
        uVar13 = (ulong)uVar12;
        local_70 = (JSShape *)(&pJVar2->proto + uVar13);
        if (*(JSAtom *)((long)&pJVar2->proto + uVar13 * 8 + 4) == prop) {
          pJVar14 = (JSValueUnion *)(*(JSProperty **)((long)p.ptr + 0x20) + (uVar13 - 1));
          break;
        }
        pJVar6 = &local_70->header;
        pJVar14 = (JSValueUnion *)0x0;
        local_70 = (JSShape *)0x0;
        uVar12 = pJVar6->ref_count & 0x3ffffff;
      } while (uVar12 != 0);
    }
    if (local_70 != (JSShape *)0x0) break;
    if ((*(byte *)((long)p.ptr + 5) & 8) == 0) goto LAB_00120eaa;
    uVar1 = *(ushort *)((long)p.ptr + 6);
    if ((ulong)uVar1 == 2) {
      cVar16 = '\0';
      if (((int)prop < 0) && ((uint)local_68._0_4_ < *(uint *)((long)p.ptr + 0x40))) {
        if (local_81 == '\0') {
          iVar9 = convert_fast_array_to_array(pJVar7,(JSObject *)p.ptr);
          cVar16 = (iVar9 == 0) + '\x01';
          local_9c = local_9c | -(uint)(iVar9 != 0);
        }
        else {
          if (((uint)flags >> 0xd & 1) != 0) {
            pJVar14 = (JSValueUnion *)((long)local_68.ptr * 0x10 + *(long *)((long)p.ptr + 0x38));
            JVar5._4_4_ = uStack_74;
            JVar5.int32 = local_78;
            if (0xfffffff4 < local_78) {
              *(int *)local_80.ptr = *local_80.ptr + 1;
            }
            local_98.ptr = pJVar14->ptr;
            JVar11 = pJVar14[1];
            JVar17 = *(JSValue *)pJVar14;
            *(JSValueUnion *)&pJVar14->int32 = local_80;
            pJVar14[1] = JVar5;
            if ((0xfffffff4 < (uint)JVar11.int32) &&
               (iVar9 = *local_98.ptr, *(int *)local_98.ptr = iVar9 + -1, iVar9 < 2)) {
              __JS_FreeValueRT(pJVar7->rt,JVar17);
            }
          }
LAB_00120baa:
          cVar16 = '\x01';
          local_9c = 1;
        }
      }
    }
    else {
      cVar16 = '\0';
      if ((ushort)(uVar1 - 0x15) < 9) {
        if ((int)prop < 0) {
          if ((uint)local_68._0_4_ <
              ((anon_union_24_22_bbf4f0e3_for_u *)((long)p.ptr + 0x30))->typed_array->length >>
              ("includes"[(ulong)uVar1 + 1] & 0x1fU)) {
            if (local_82 == '\0') {
              cVar16 = '\x01';
              if (((uint)flags >> 0xd & 1) == 0) goto LAB_00120baa;
              local_98.float64 = local_80.float64;
              iStack_38 = CONCAT44(uStack_74,local_78);
              if (0xfffffff4 < local_78) {
                *(int *)local_80.ptr = *local_80.ptr + 1;
              }
              local_40.float64 = local_80.float64;
              val_00.tag = iStack_38;
              val_00.u.float64 = local_80.float64;
              this_obj_00.tag = local_50;
              this_obj_00.u.float64 = local_48.float64;
              prop_00.tag = 0;
              prop_00.u = local_68;
              local_9c = JS_SetPropertyValue(pJVar7,this_obj_00,prop_00,val_00,flags);
              goto LAB_00120d1d;
            }
            fmt = "invalid descriptor flags";
          }
          else {
LAB_00120cfe:
            fmt = "out-of-bound index in typed array";
          }
LAB_00120d0c:
          local_9c = JS_ThrowTypeErrorOrFalse(pJVar7,flags,fmt);
        }
        else {
          JVar17 = JS_AtomIsNumericIndex1(pJVar7,prop);
          JVar11 = JVar17.u;
          uVar12 = (uint)JVar17.tag;
          if (uVar12 == 3) goto LAB_00120d1d;
          if (uVar12 != 6) {
            iVar9 = JS_NumberIsInteger(pJVar7,JVar17);
            local_98 = JVar11;
            if (-1 < iVar9) {
              if (iVar9 == 0) {
                if ((0xfffffff4 < uVar12) &&
                   (iVar9 = *JVar11.ptr, *(int *)JVar11.ptr = iVar9 + -1, iVar9 < 2)) {
                  __JS_FreeValueRT(pJVar7->rt,JVar17);
                }
                fmt = "non integer index in typed array";
              }
              else {
                if (uVar12 == 7) {
                  uVar15 = JVar17.u._4_4_ >> 0x1f;
                }
                else {
                  uVar15 = 0;
                  if (uVar12 == 0) {
                    uVar15 = (uint)((ulong)JVar11.ptr >> 0x1f) & 1;
                  }
                }
                if ((0xfffffff4 < uVar12) &&
                   (iVar9 = *JVar11.ptr, *(int *)JVar11.ptr = iVar9 + -1, iVar9 < 2)) {
                  __JS_FreeValueRT(pJVar7->rt,JVar17);
                }
                if (uVar15 == 0) goto LAB_00120cfe;
                fmt = "negative index in typed array";
              }
              goto LAB_00120d0c;
            }
            if ((0xfffffff4 < uVar12) &&
               (iVar9 = *JVar11.ptr, *(int *)JVar11.ptr = iVar9 + -1, iVar9 < 2)) {
              __JS_FreeValueRT(pJVar7->rt,JVar17);
            }
          }
          local_9c = 0xffffffff;
        }
        cVar16 = '\x01';
      }
    }
LAB_00120d1d:
    if (cVar16 != '\x02') {
      if (cVar16 != '\0') {
        return local_9c;
      }
LAB_00120eaa:
      val_01.tag._0_4_ = local_78;
      val_01.u.float64 = local_80.float64;
      val_01.tag._4_4_ = uStack_74;
      iVar9 = JS_CreateProperty(pJVar7,(JSObject *)p.ptr,prop,val_01,getter,setter,flags);
      return iVar9;
    }
  } while( true );
  if ((((uint)flags >> 0xd & 1) != 0) &&
     (((ulong)*(JSObject **)&(local_70->header).ref_count & 0x20000000) != 0)) {
    local_98.float64 = local_80.float64;
    if (0xfffffff4 < local_78) {
      *(int *)local_80.ptr = *local_80.ptr + 1;
    }
    JVar17.tag._0_4_ = local_78;
    JVar17.u.float64 = local_80.float64;
    JVar17.tag._4_4_ = uStack_74;
    iVar9 = JS_ToArrayLengthFree(local_90,(uint32_t *)&local_98.int32,JVar17,0);
    uVar12 = 0xffffffff;
    if (iVar9 == 0) {
      JVar11 = (JSValueUnion)(long)local_98.int32;
      local_80.float64 = (double)((ulong)local_98.ptr & 0xffffffff);
      if (-1 < (long)JVar11.ptr) {
        local_80 = JVar11;
      }
      local_78 = 7;
      if (-1 < (long)JVar11.ptr) {
        local_78 = 0;
      }
      uStack_74 = 0;
      pJVar2 = *(JSShape **)((long)p.ptr + 0x18);
      uVar15 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
      while( true ) {
        local_70 = (JSShape *)0x0;
        pJVar14 = (JSValueUnion *)0x0;
        uVar12 = local_9c;
        if (uVar15 == 0) break;
        uVar13 = (ulong)uVar15;
        local_70 = (JSShape *)(&pJVar2->proto + uVar13);
        if (*(JSAtom *)((long)&pJVar2->proto + uVar13 * 8 + 4) == prop) {
          pJVar14 = (JSValueUnion *)(*(JSProperty **)((long)p.ptr + 0x20) + (uVar13 - 1));
          break;
        }
        uVar15 = (local_70->header).ref_count & 0x3ffffff;
      }
    }
    local_9c = uVar12;
    if (iVar9 != 0) {
      return uVar12;
    }
  }
  pJVar2 = local_70;
  uVar12 = (local_70->header).ref_count;
  BVar8 = check_define_prop_flags(uVar12 >> 0x1a,flags);
  pJVar7 = local_90;
  if (BVar8 == 0) goto LAB_001213c8;
  uVar15 = uVar12 >> 0x1a & 0xfffffff0;
  if (uVar15 == 0x30) {
    iVar9 = JS_AutoInitProperty(local_90,(JSObject *)p.ptr,prop,(JSProperty *)pJVar14,
                                (JSShapeProperty *)pJVar2);
    if (iVar9 != 0) {
      return -1;
    }
    goto LAB_001209c8;
  }
  if ((flags & 0x3a00U) == 0) goto LAB_001213e4;
  if ((flags & 0x1800U) == 0) {
    if (uVar15 != 0x20) {
      if (uVar15 == 0x10) {
        iVar9 = js_shape_prepare_update(local_90,(JSObject *)p.ptr,(JSShapeProperty **)&local_70);
        pJVar7 = local_90;
        if (iVar9 != 0) {
          return -1;
        }
        if (pJVar14->ptr != (void *)0x0) {
          v.tag = -1;
          v.u.ptr = pJVar14->ptr;
          JS_FreeValue(local_90,v);
        }
        if (pJVar14[1].ptr != (void *)0x0) {
          v_00.tag = -1;
          v_00.u.ptr = pJVar14[1].ptr;
          JS_FreeValue(pJVar7,v_00);
        }
        (local_70->header).ref_count = (local_70->header).ref_count & 0x37ffffff;
        pJVar14->int32 = 0;
        pJVar14[1].float64 = 1.48219693752374e-323;
      }
      else if ((uVar12 & 0xc000000) == 0 && ((uint)flags >> 0xd & 1) != 0) {
        op1.tag._0_4_ = local_78;
        op1.u.ptr = local_80.ptr;
        op1.tag._4_4_ = uStack_74;
        BVar8 = js_same_value(local_90,op1,*(JSValue *)pJVar14);
        if (BVar8 != 0) {
          return 1;
        }
        goto LAB_001213c8;
      }
    }
    pJVar7 = local_90;
    if (((uint)(local_70->header).ref_count >> 0x1d & 1) != 0) {
      iVar9 = 1;
      if (((uint)flags >> 0xd & 1) != 0) {
        local_98.float64 = local_80.float64;
        if (0xfffffff4 < local_78) {
          *(int *)local_80.ptr = *local_80.ptr + 1;
        }
        val_02.tag._0_4_ = local_78;
        val_02.u.ptr = local_80.ptr;
        val_02.tag._4_4_ = uStack_74;
        iVar9 = set_array_length(local_90,(JSObject *)p.ptr,val_02,flags);
      }
      if ((flags & 0x202U) == 0x200) {
        local_70 = *(JSShape **)((long)p.ptr + 0x18) + 1;
        iVar10 = js_update_property_flags
                           (pJVar7,(JSObject *)p.ptr,(JSShapeProperty **)&local_70,
                            (uint)(*(JSShape **)((long)p.ptr + 0x18))[1].header.ref_count >> 0x1a &
                            0xfffffffd);
        if (iVar10 != 0) {
          return -1;
        }
      }
      return iVar9;
    }
    if (((uint)flags >> 0xd & 1) != 0) {
      JS_FreeValue(local_90,*(JSValue *)pJVar14);
      local_98.float64 = local_80.float64;
      if (0xfffffff4 < local_78) {
        *(int *)local_80.ptr = *local_80.ptr + 1;
      }
      pJVar14->ptr = (void *)local_80;
      JVar11._4_4_ = uStack_74;
      JVar11.int32 = local_78;
      pJVar14[1] = JVar11;
    }
    if ((((uint)flags >> 9 & 1) != 0) &&
       (iVar9 = js_update_property_flags
                          (local_90,(JSObject *)p.ptr,(JSShapeProperty **)&local_70,
                           flags & 2U | (uint)(local_70->header).ref_count >> 0x1a & 0xfffffffd),
       iVar9 != 0)) {
      return -1;
    }
    goto LAB_001213e4;
  }
  iVar9 = JS_IsFunction(local_90,getter);
  local_68 = getter.u;
  if (iVar9 == 0) {
    local_68.float64 = 0.0;
  }
  iVar9 = JS_IsFunction(pJVar7,setter);
  JVar11 = setter.u;
  if (iVar9 == 0) {
    JVar11.float64 = 0.0;
  }
  if ((uVar12 & 0xc0000000) == 0x40000000) {
    if (((uVar12 >> 0x1a & 1) != 0) ||
       (((((uint)flags >> 0xb & 1) == 0 || (iVar9 = 3, local_68.ptr == pJVar14->ptr)) &&
        ((((uint)flags >> 0xc & 1) == 0 || (iVar9 = 3, JVar11.ptr == pJVar14[1].ptr)))))) {
LAB_00121319:
      if (((uint)flags >> 0xb & 1) != 0) {
        if (pJVar14->ptr != (void *)0x0) {
          v_01.tag = -1;
          v_01.u.ptr = pJVar14->ptr;
          JS_FreeValue(pJVar7,v_01);
        }
        if ((local_68.ptr != (void *)0x0) && (local_98 = getter.u, 0xfffffff4 < (uint)getter.tag)) {
          *(int *)getter.u.ptr = *getter.u.ptr + 1;
        }
        *pJVar14 = local_68;
      }
      iVar9 = 0;
      if (((uint)flags >> 0xc & 1) != 0) {
        if (pJVar14[1].ptr != (void *)0x0) {
          v_02.tag = -1;
          v_02.u.ptr = pJVar14[1].ptr;
          JS_FreeValue(pJVar7,v_02);
        }
        if ((JVar11.ptr != (void *)0x0) && (local_98 = setter.u, 0xfffffff4 < (uint)setter.tag)) {
          *(int *)setter.u.ptr = *setter.u.ptr + 1;
        }
        pJVar14[1] = JVar11;
      }
    }
  }
  else {
    iVar9 = js_shape_prepare_update(pJVar7,(JSObject *)p.ptr,(JSShapeProperty **)&local_70);
    if (iVar9 == 0) {
      JS_FreeValue(pJVar7,*(JSValue *)pJVar14);
      (local_70->header).ref_count = (local_70->header).ref_count & 0x17ffffffU | 0x40000000;
      pJVar14->float64 = 0.0;
      pJVar14[1].float64 = 0.0;
      goto LAB_00121319;
    }
    local_9c = 0xffffffff;
    iVar9 = 1;
  }
  if (iVar9 == 0) {
LAB_001213e4:
    uVar12 = (uint)(local_70->header).ref_count >> 0x1a;
    iVar9 = js_update_property_flags
                      (local_90,(JSObject *)p.ptr,(JSShapeProperty **)&local_70,
                       local_5c & (flags ^ uVar12) & 5 ^ uVar12);
    return -(uint)(iVar9 != 0) | 1;
  }
  if (iVar9 != 3) {
    return local_9c;
  }
LAB_001213c8:
  iVar9 = JS_ThrowTypeErrorOrFalse(local_90,flags,"property is not configurable");
  return iVar9;
}

Assistant:

int JS_DefineProperty(JSContext *ctx, JSValueConst this_obj,
                      JSAtom prop, JSValueConst val,
                      JSValueConst getter, JSValueConst setter, int flags)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int mask, res;

    if (JS_VALUE_GET_TAG(this_obj) != JS_TAG_OBJECT) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    p = JS_VALUE_GET_OBJ(this_obj);

 redo_prop_update:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* the range of the Array length property is always tested before */
        if ((prs->flags & JS_PROP_LENGTH) && (flags & JS_PROP_HAS_VALUE)) {
            uint32_t array_length;
            if (JS_ToArrayLengthFree(ctx, &array_length,
                                     JS_DupValue(ctx, val), FALSE)) {
                return -1;
            }
            /* this code relies on the fact that Uint32 are never allocated */
            val = (JSValueConst)JS_NewUint32(ctx, array_length);
            /* prs may have been modified */
            prs = find_own_property(&pr, p, prop);
            assert(prs != NULL);
        }
        /* property already exists */
        if (!check_define_prop_flags(prs->flags, flags)) {
        not_configurable:
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "property is not configurable");
        }

        if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs))
                return -1;
            goto redo_prop_update;
        }

        if (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE |
                     JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                JSObject *new_getter, *new_setter;

                if (JS_IsFunction(ctx, getter)) {
                    new_getter = JS_VALUE_GET_OBJ(getter);
                } else {
                    new_getter = NULL;
                }
                if (JS_IsFunction(ctx, setter)) {
                    new_setter = JS_VALUE_GET_OBJ(setter);
                } else {
                    new_setter = NULL;
                }

                if ((prs->flags & JS_PROP_TMASK) != JS_PROP_GETSET) {
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    /* convert to getset */
                    if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                        free_var_ref(ctx->rt, pr->u.var_ref);
                    } else {
                        JS_FreeValue(ctx, pr->u.value);
                    }
                    prs->flags = (prs->flags &
                                  (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
                        JS_PROP_GETSET;
                    pr->u.getset.getter = NULL;
                    pr->u.getset.setter = NULL;
                } else {
                    if (!(prs->flags & JS_PROP_CONFIGURABLE)) {
                        if ((flags & JS_PROP_HAS_GET) &&
                            new_getter != pr->u.getset.getter) {
                            goto not_configurable;
                        }
                        if ((flags & JS_PROP_HAS_SET) &&
                            new_setter != pr->u.getset.setter) {
                            goto not_configurable;
                        }
                    }
                }
                if (flags & JS_PROP_HAS_GET) {
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (new_getter)
                        JS_DupValue(ctx, getter);
                    pr->u.getset.getter = new_getter;
                }
                if (flags & JS_PROP_HAS_SET) {
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    if (new_setter)
                        JS_DupValue(ctx, setter);
                    pr->u.getset.setter = new_setter;
                }
            } else {
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                    /* convert to data descriptor */
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    pr->u.value = JS_UNDEFINED;
                } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    /* Note: JS_PROP_VARREF is always writable */
                } else {
                    if ((prs->flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                        (flags & JS_PROP_HAS_VALUE)) {
                        if (!js_same_value(ctx, val, pr->u.value)) {
                            goto not_configurable;
                        } else {
                            return TRUE;
                        }
                    }
                }
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        if (p->class_id == JS_CLASS_MODULE_NS) {
                            /* JS_PROP_WRITABLE is always true for variable
                               references, but they are write protected in module name
                               spaces. */
                            if (!js_same_value(ctx, val, *pr->u.var_ref->pvalue))
                                goto not_configurable;
                        }
                        /* update the reference */
                        set_value(ctx, pr->u.var_ref->pvalue,
                                  JS_DupValue(ctx, val));
                    }
                    /* if writable is set to false, no longer a
                       reference (for mapped arguments) */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) == JS_PROP_HAS_WRITABLE) {
                        JSValue val1;
                        if (js_shape_prepare_update(ctx, p, &prs))
                            return -1;
                        val1 = JS_DupValue(ctx, *pr->u.var_ref->pvalue);
                        free_var_ref(ctx->rt, pr->u.var_ref);
                        pr->u.value = val1;
                        prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    }
                } else if (prs->flags & JS_PROP_LENGTH) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        /* Note: no JS code is executable because
                           'val' is guaranted to be a Uint32 */
                        res = set_array_length(ctx, p, JS_DupValue(ctx, val),
                                               flags);
                    } else {
                        res = TRUE;
                    }
                    /* still need to reset the writable flag if
                       needed.  The JS_PROP_LENGTH is kept because the
                       Uint32 test is still done if the length
                       property is read-only. */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) ==
                        JS_PROP_HAS_WRITABLE) {
                        prs = get_shape_prop(p->shape);
                        if (js_update_property_flags(ctx, p, &prs,
                                                     prs->flags & ~JS_PROP_WRITABLE))
                            return -1;
                    }
                    return res;
                } else {
                    if (flags & JS_PROP_HAS_VALUE) {
                        JS_FreeValue(ctx, pr->u.value);
                        pr->u.value = JS_DupValue(ctx, val);
                    }
                    if (flags & JS_PROP_HAS_WRITABLE) {
                        if (js_update_property_flags(ctx, p, &prs,
                                                     (prs->flags & ~JS_PROP_WRITABLE) |
                                                     (flags & JS_PROP_WRITABLE)))
                            return -1;
                    }
                }
            }
        }
        mask = 0;
        if (flags & JS_PROP_HAS_CONFIGURABLE)
            mask |= JS_PROP_CONFIGURABLE;
        if (flags & JS_PROP_HAS_ENUMERABLE)
            mask |= JS_PROP_ENUMERABLE;
        if (js_update_property_flags(ctx, p, &prs,
                                     (prs->flags & ~mask) | (flags & mask)))
            return -1;
        return TRUE;
    }

    /* handle modification of fast array elements */
    if (p->fast_array) {
        uint32_t idx;
        uint32_t prop_flags;
        if (p->class_id == JS_CLASS_ARRAY) {
            if (__JS_AtomIsTaggedInt(prop)) {
                idx = __JS_AtomToUInt32(prop);
                if (idx < p->u.array.count) {
                    prop_flags = get_prop_flags(flags, JS_PROP_C_W_E);
                    if (prop_flags != JS_PROP_C_W_E)
                        goto convert_to_slow_array;
                    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                    convert_to_slow_array:
                        if (convert_fast_array_to_array(ctx, p))
                            return -1;
                        else
                            goto redo_prop_update;
                    }
                    if (flags & JS_PROP_HAS_VALUE) {
                        set_value(ctx, &p->u.array.u.values[idx], JS_DupValue(ctx, val));
                    }
                    return TRUE;
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            JSValue num;
            int ret;

            if (!__JS_AtomIsTaggedInt(prop)) {
                /* slow path with to handle all numeric indexes */
                num = JS_AtomIsNumericIndex1(ctx, prop);
                if (JS_IsUndefined(num))
                    goto typed_array_done;
                if (JS_IsException(num))
                    return -1;
                ret = JS_NumberIsInteger(ctx, num);
                if (ret < 0) {
                    JS_FreeValue(ctx, num);
                    return -1;
                }
                if (!ret) {
                    JS_FreeValue(ctx, num);
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "non integer index in typed array");
                }
                ret = JS_NumberIsNegativeOrMinusZero(ctx, num);
                JS_FreeValue(ctx, num);
                if (ret) {
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "negative index in typed array");
                }
                if (!__JS_AtomIsTaggedInt(prop))
                    goto typed_array_oob;
            }
            idx = __JS_AtomToUInt32(prop);
            /* if the typed array is detached, p->u.array.count = 0 */
            if (idx >= typed_array_get_length(ctx, p)) {
            typed_array_oob:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound index in typed array");
            }
            prop_flags = get_prop_flags(flags, JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET) ||
                prop_flags != (JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE)) {
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "invalid descriptor flags");
            }
            if (flags & JS_PROP_HAS_VALUE) {
                return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), JS_DupValue(ctx, val), flags);
            }
            return TRUE;
        typed_array_done: ;
        }
    }

    return JS_CreateProperty(ctx, p, prop, val, getter, setter, flags);
}